

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

Expression * __thiscall
wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
findBreakTarget(ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                *this,Name name)

{
  Expression *this_00;
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Block *pBVar4;
  Loop *pLVar5;
  Loop *loop;
  Block *block;
  Expression *curr;
  Index i;
  ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
  *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  bVar1 = SmallVector<wasm::Expression_*,_10UL>::empty(&this->expressionStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!expressionStack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                  ,0x1d5,
                  "Expression *wasm::ExpressionStackWalker<wasm::Flatten, wasm::UnifiedExpressionVisitor<wasm::Flatten>>::findBreakTarget(Name) [SubType = wasm::Flatten, VisitorType = wasm::UnifiedExpressionVisitor<wasm::Flatten>]"
                 );
  }
  sVar2 = SmallVector<wasm::Expression_*,_10UL>::size(&this->expressionStack);
  curr._4_4_ = (uint)sVar2;
  do {
    curr._4_4_ = curr._4_4_ - 1;
    ppEVar3 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                        (&this->expressionStack,(ulong)curr._4_4_);
    this_00 = *ppEVar3;
    pBVar4 = Expression::dynCast<wasm::Block>(this_00);
    if (pBVar4 == (Block *)0x0) {
      pLVar5 = Expression::dynCast<wasm::Loop>(this_00);
      if ((pLVar5 != (Loop *)0x0) &&
         (bVar1 = IString::operator==((IString *)&this_local,&(pLVar5->name).super_IString), bVar1))
      {
        return this_00;
      }
    }
    else {
      bVar1 = IString::operator==((IString *)&this_local,&(pBVar4->name).super_IString);
      if (bVar1) {
        return this_00;
      }
    }
    if (curr._4_4_ == 0) {
      return (Expression *)0x0;
    }
  } while( true );
}

Assistant:

Expression* findBreakTarget(Name name) {
    assert(!expressionStack.empty());
    Index i = expressionStack.size() - 1;
    while (true) {
      auto* curr = expressionStack[i];
      if (Block* block = curr->template dynCast<Block>()) {
        if (name == block->name) {
          return curr;
        }
      } else if (Loop* loop = curr->template dynCast<Loop>()) {
        if (name == loop->name) {
          return curr;
        }
      }
      if (i == 0) {
        return nullptr;
      }
      i--;
    }
  }